

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_iterator.hpp
# Opt level: O1

void __thiscall
boost::algorithm::
split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::split_iterator(split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *Other)

{
  vtable_base *pvVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  (this->
  super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).m_Finder.super_function_base.vtable = (vtable_base *)0x0;
  pvVar1 = (Other->
           super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).m_Finder.super_function_base.vtable;
  if (pvVar1 != (vtable_base *)0x0) {
    (this->
    super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).m_Finder.super_function_base.vtable = pvVar1;
    if (((ulong)pvVar1 & 1) == 0) {
      (*pvVar1->manager)(&(Other->
                          super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ).m_Finder.super_function_base.functor,
                         &(this->
                          super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ).m_Finder.super_function_base.functor,clone_functor_tag);
    }
    else {
      *(undefined8 *)
       ((long)&(this->
               super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).m_Finder.super_function_base.functor + 0x10) =
           *(undefined8 *)
            ((long)&(Other->
                    super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).m_Finder.super_function_base.functor + 0x10);
      uVar2 = *(undefined8 *)
               ((long)&(Other->
                       super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).m_Finder.super_function_base.functor + 8);
      *(undefined8 *)
       &(this->
        super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).m_Finder.super_function_base.functor =
           *(undefined8 *)
            &(Other->
             super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).m_Finder.super_function_base.functor;
      *(undefined8 *)
       ((long)&(this->
               super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).m_Finder.super_function_base.functor + 8) = uVar2;
    }
  }
  pcVar3 = (Other->m_Match).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End._M_current;
  (this->m_Match).
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current =
       (Other->m_Match).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin._M_current;
  (this->m_Match).
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = pcVar3;
  (this->m_Next)._M_current = (Other->m_Next)._M_current;
  (this->m_End)._M_current = (Other->m_End)._M_current;
  this->m_bEof = Other->m_bEof;
  return;
}

Assistant:

split_iterator( const split_iterator& Other ) :
                base_type(Other),
                m_Match(Other.m_Match),
                m_Next(Other.m_Next),
                m_End(Other.m_End),
                m_bEof(Other.m_bEof)
            {}